

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O3

void __thiscall
AlsavoSession::Connect
          (AlsavoSession *this,string *serverIP,int16_t serverPort,string *serial,string *passwd)

{
  ConnectionStatus CVar1;
  double __x;
  uint uVar2;
  int iVar3;
  Verbosity VVar4;
  time_t tVar5;
  ulong uVar6;
  rep rVar7;
  double __x_00;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uchar respdata [16];
  MD5_CTX ctx;
  char rcvBuf [512];
  ConnectionStatus local_350 [2];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_334;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  Timestamp local_310;
  undefined1 local_308;
  undefined7 uStack_307;
  undefined1 local_300;
  undefined7 uStack_2ff;
  undefined4 local_2f8;
  uint32_t local_2f4;
  uint64_t local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  Timestamp local_2d8;
  MD5_CTX local_2d0;
  char local_238 [4];
  undefined8 local_234;
  int local_228;
  uint32_t uStack_224;
  
  std::__cxx11::string::_M_assign((string *)&this->m_SerialNo);
  std::__cxx11::string::_M_assign((string *)&this->m_Password);
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  MD5_Init(&local_2d0);
  MD5_Update(&local_2d0,(this->m_Password)._M_dataplus._M_p,
             (ulong)(uint)(this->m_Password)._M_string_length);
  MD5_Final(this->m_HashedPW,&local_2d0);
  (this->m_DestAddr).sin_zero[4] = '\0';
  (this->m_DestAddr).sin_zero[5] = '\0';
  (this->m_DestAddr).sin_zero[6] = '\0';
  (this->m_DestAddr).sin_zero[7] = '\0';
  (this->m_DestAddr).sin_addr = 0;
  (this->m_DestAddr).sin_zero[0] = '\0';
  (this->m_DestAddr).sin_zero[1] = '\0';
  (this->m_DestAddr).sin_zero[2] = '\0';
  (this->m_DestAddr).sin_zero[3] = '\0';
  (this->m_DestAddr).sin_family = 2;
  (this->m_DestAddr).sin_port = serverPort << 8 | (ushort)serverPort >> 8;
  inet_pton(2,(serverIP->_M_dataplus)._M_p,&(this->m_DestAddr).sin_addr);
  uVar6 = atoll((serial->_M_dataplus)._M_p);
  this->m_SerialQ =
       uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
       (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
       (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  Disconnect(this);
  uVar2 = rand();
  iVar3 = rand();
  this->m_ClientToken = iVar3 << 0x10 | uVar2;
  iVar3 = socket(2,2,0);
  this->m_Sock = iVar3;
  VVar4 = loguru::current_verbosity_cutoff();
  if (-1 < VVar4) {
    loguru::log(__x_00);
  }
  local_2f4 = this->m_ClientToken;
  local_2f0 = this->m_SerialQ;
  local_308 = 0x32;
  uStack_2ff = 0x2800f200000000;
  uStack_307 = 0;
  local_300 = 0;
  local_2f8 = 0x20101;
  local_2e8 = 0xd3e2eeacffffffff;
  uStack_2e0 = 0x6afdc75500000000;
  Timestamp::Now(&local_2d8);
  sendto(this->m_Sock,&local_308,0x38,0,(sockaddr *)&this->m_DestAddr,0x10);
  iVar3 = RecvWithTimeout(this,local_238,0x200,2000);
  if (iVar3 == 0) {
    iVar3 = loguru::current_verbosity_cutoff();
    __x = extraout_XMM0_Qa;
  }
  else if (local_228 == 3) {
    this->m_CSID = (undefined4)local_234;
    this->m_DSID = local_234._4_4_;
    this->m_ServerToken = uStack_224;
    VVar4 = loguru::current_verbosity_cutoff();
    if (-1 < VVar4) {
      loguru::log(__x_01);
    }
    MD5_Init(&local_2d0);
    MD5_Update(&local_2d0,&this->m_ClientToken,4);
    MD5_Update(&local_2d0,&this->m_ServerToken,4);
    MD5_Update(&local_2d0,this->m_HashedPW,0x10);
    MD5_Final((uchar *)&local_348,&local_2d0);
    local_334 = 0x32;
    local_330._0_4_ = this->m_CSID;
    local_330._4_4_ = this->m_DSID;
    local_328 = 0x30000041c00f200;
    Timestamp::Now(&local_310);
    local_320 = local_348;
    uStack_318 = uStack_340;
    sendto(this->m_Sock,&local_334,0x2c,0,(sockaddr *)&this->m_DestAddr,0x10);
    iVar3 = RecvWithTimeout(this,local_238,0x200,2000);
    if (iVar3 == 0) {
      iVar3 = loguru::current_verbosity_cutoff();
      __x = extraout_XMM0_Qa_01;
    }
    else {
      if (local_228 == 5) {
        rVar7 = std::chrono::_V2::system_clock::now();
        (this->m_LastPacketRcvTime).__d.__r = rVar7;
        CVar1 = this->m_ConnectionStatus;
        this->m_ConnectionStatus = Connected;
        if (CVar1 != Connected &&
            (this->m_ConnStatusCB).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_350[1] = 1;
          local_350[0] = CVar1;
          (*(this->m_ConnStatusCB)._M_invoker)
                    ((_Any_data *)&this->m_ConnStatusCB,local_350 + 1,local_350);
        }
        VVar4 = loguru::current_verbosity_cutoff();
        if (VVar4 < 0) {
          return;
        }
        loguru::log(__x_02);
        return;
      }
      iVar3 = loguru::current_verbosity_cutoff();
      __x = extraout_XMM0_Qa_02;
    }
  }
  else {
    iVar3 = loguru::current_verbosity_cutoff();
    __x = extraout_XMM0_Qa_00;
  }
  if (-3 < iVar3) {
    loguru::log(__x);
  }
  Disconnect(this);
  return;
}

Assistant:

void Connect(const std::string serverIP, int16_t serverPort, const std::string &serial, const std::string &passwd)
	{
		m_SerialNo = serial;
		m_Password = passwd;

		srand((uint32_t)time(NULL));

		MD5_CTX ctx;
		MD5_Init(&ctx);
		MD5_Update(&ctx, (char*)m_Password.c_str(), (unsigned int)m_Password.length());
		MD5_Final(m_HashedPW, &ctx);

		memset(&m_DestAddr, 0, sizeof(sockaddr_in));
		m_DestAddr.sin_family = AF_INET;
		m_DestAddr.sin_port = htons(serverPort);
		inet_pton(AF_INET, serverIP.c_str(), &m_DestAddr.sin_addr);
		int64_t s = atoll(serial.c_str());
		m_SerialQ = htonll(s);

		Disconnect();

		m_ClientToken = rand() | (rand() << 16);
		m_Sock = socket(AF_INET, SOCK_DGRAM, 0);

		char rcvBuf[512];

		LOG_F(INFO, "Connecting to %s:%d...", serverIP.c_str(), serverPort);

		AuthIntro intro(m_ClientToken, m_SerialQ);
		sendto(m_Sock, (const char*)&intro, 56, 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));
		
		int bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding, disconnecting");
			Disconnect();
			return;
		}

		AuthChallenge* challenge = (AuthChallenge*)rcvBuf;

		if (!(challenge->act1 == 3 && challenge->act2 == 0 && challenge->act3 == 0 && challenge->act4 == 0))
		{
			LOG_F(ERROR, "Invalid auth challenge packet (pump offline?), disconnecting");
			Disconnect();
			return;
		}

		m_CSID = challenge->hdr.csid;
		m_DSID = challenge->hdr.dsid;
		m_ServerToken = challenge->serverToken;

		LOG_F(INFO, "Received handshake, CSID=%08X, DSID=%08X, server token %08X", m_CSID, m_DSID, m_ServerToken);

		MD5_Init(&ctx);
		MD5_Update(&ctx, &m_ClientToken, 4);
		MD5_Update(&ctx, &m_ServerToken, 4);
		MD5_Update(&ctx, m_HashedPW, 16);

		unsigned char respdata[16];
		MD5_Final(respdata, &ctx);

		AuthResponse resp(m_CSID, m_DSID, respdata);
		sendto(m_Sock, (const char*)&resp, sizeof(resp), 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));

		bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding to auth response, disconnecting");
			Disconnect();
			return;
		}

		uint32_t act = *(uint32_t*)(&rcvBuf[sizeof(PacketHeader)]);
		if (act != 0x00000005)
		{
			LOG_F(ERROR, "Server returned error in auth, disconnecting");
			Disconnect();
			return;

		}
		m_LastPacketRcvTime = std::chrono::system_clock::now();
		UpdateConnectionStatus(ConnectionStatus::Connected);

		LOG_F(INFO, "Connection complete.");

		return;
	}